

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_Test::
TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_Test
          (TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockComparatorCopierTest::TEST_GROUP_CppUTestGroupMockComparatorCopierTest
            (&this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest);
  (this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002bbf00;
  return;
}

Assistant:

TEST(MockComparatorCopierTest, installCopiersWorksHierarchically)
{
    MyTypeForTesting object(1);
    MyTypeForTestingCopier copier;

    mock("existing");
    mock().installCopier("MyTypeForTesting", copier);
    mock("existing").expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &object);
    mock("existing").actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &object);

    mock().checkExpectations();
    mock().removeAllComparatorsAndCopiers();
}